

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *args_1;
  ArgumentListSyntax *pAVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::ArgumentSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ArgumentSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::ArgumentListSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,&local_40);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const ArgumentListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ArgumentListSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.parameters, alloc),
        node.closeParen.deepClone(alloc)
    );
}